

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::remove_modify_callback
          (Fl_Text_Buffer *this,Fl_Text_Modify_Cb bufModifiedCB,void *cbArg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  Fl_Text_Modify_Cb *pp_Var4;
  void **ppvVar5;
  void **newCBArgs;
  Fl_Text_Modify_Cb *newModifyProcs;
  int toRemove;
  int i;
  void *cbArg_local;
  Fl_Text_Modify_Cb bufModifiedCB_local;
  Fl_Text_Buffer *this_local;
  
  newModifyProcs._0_4_ = -1;
  newModifyProcs._4_4_ = 0;
  do {
    if (this->mNModifyProcs <= newModifyProcs._4_4_) {
LAB_0021c6c7:
      if ((int)newModifyProcs == -1) {
        (*Fl::error)("Fl_Text_Buffer::remove_modify_callback(): Can\'t find modify CB to remove");
      }
      else {
        this->mNModifyProcs = this->mNModifyProcs + -1;
        if (this->mNModifyProcs == 0) {
          this->mNModifyProcs = 0;
          if (this->mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
            operator_delete__(this->mModifyProcs);
          }
          this->mModifyProcs = (Fl_Text_Modify_Cb *)0x0;
          if (this->mCbArgs != (void **)0x0) {
            operator_delete__(this->mCbArgs);
          }
          this->mCbArgs = (void **)0x0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (long)this->mNModifyProcs;
          uVar3 = SUB168(auVar1 * ZEXT816(8),0);
          if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
            uVar3 = 0xffffffffffffffff;
          }
          pp_Var4 = (Fl_Text_Modify_Cb *)operator_new__(uVar3);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)this->mNModifyProcs;
          uVar3 = SUB168(auVar2 * ZEXT816(8),0);
          if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
            uVar3 = 0xffffffffffffffff;
          }
          ppvVar5 = (void **)operator_new__(uVar3);
          for (newModifyProcs._4_4_ = 0; newModifyProcs._4_4_ < (int)newModifyProcs;
              newModifyProcs._4_4_ = newModifyProcs._4_4_ + 1) {
            pp_Var4[newModifyProcs._4_4_] = this->mModifyProcs[newModifyProcs._4_4_];
            ppvVar5[newModifyProcs._4_4_] = this->mCbArgs[newModifyProcs._4_4_];
          }
          for (; newModifyProcs._4_4_ < this->mNModifyProcs;
              newModifyProcs._4_4_ = newModifyProcs._4_4_ + 1) {
            pp_Var4[newModifyProcs._4_4_] = this->mModifyProcs[newModifyProcs._4_4_ + 1];
            ppvVar5[newModifyProcs._4_4_] = this->mCbArgs[newModifyProcs._4_4_ + 1];
          }
          if (this->mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
            operator_delete__(this->mModifyProcs);
          }
          if (this->mCbArgs != (void **)0x0) {
            operator_delete__(this->mCbArgs);
          }
          this->mModifyProcs = pp_Var4;
          this->mCbArgs = ppvVar5;
        }
      }
      return;
    }
    if ((this->mModifyProcs[newModifyProcs._4_4_] == bufModifiedCB) &&
       (this->mCbArgs[newModifyProcs._4_4_] == cbArg)) {
      newModifyProcs._0_4_ = newModifyProcs._4_4_;
      goto LAB_0021c6c7;
    }
    newModifyProcs._4_4_ = newModifyProcs._4_4_ + 1;
  } while( true );
}

Assistant:

void Fl_Text_Buffer::remove_modify_callback(Fl_Text_Modify_Cb bufModifiedCB, 
                                            void *cbArg)
{
  int i, toRemove = -1;
  
  /* find the matching callback to remove */
  for (i = 0; i < mNModifyProcs; i++) {
    if (mModifyProcs[i] == bufModifiedCB && mCbArgs[i] == cbArg) {
      toRemove = i;
      break;
    }
  }
  if (toRemove == -1) {
    Fl::error
    ("Fl_Text_Buffer::remove_modify_callback(): Can't find modify CB to remove");
    return;
  }
  
  /* Allocate new lists for remaining callback procs and args (if
   any are left) */
  mNModifyProcs--;
  if (mNModifyProcs == 0) {
    mNModifyProcs = 0;
    delete[]mModifyProcs;
    mModifyProcs = NULL;
    delete[]mCbArgs;
    mCbArgs = NULL;
    return;
  }
  Fl_Text_Modify_Cb *newModifyProcs = new Fl_Text_Modify_Cb[mNModifyProcs];
  void **newCBArgs = new void *[mNModifyProcs];
  
  /* copy out the remaining members and free the old lists */
  for (i = 0; i < toRemove; i++) {
    newModifyProcs[i] = mModifyProcs[i];
    newCBArgs[i] = mCbArgs[i];
  }
  for (; i < mNModifyProcs; i++) {
    newModifyProcs[i] = mModifyProcs[i + 1];
    newCBArgs[i] = mCbArgs[i + 1];
  }
  delete[]mModifyProcs;
  delete[]mCbArgs;
  mModifyProcs = newModifyProcs;
  mCbArgs = newCBArgs;
}